

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors1ReturnChain
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<unsigned_long> __l_01;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  allocator<char> local_141;
  undefined4 local_140;
  allocator<Flags<CommandFlavourFlagBits>_> local_13b;
  Flags<CommandFlavourFlagBits> local_13a;
  Flags<CommandFlavourFlagBits> local_139;
  Flags<CommandFlavourFlagBits> *local_138;
  size_type local_130;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_128;
  allocator<Flags<CommandFlavourFlagBits>_> local_10b;
  Flags<CommandFlavourFlagBits> local_10a;
  Flags<CommandFlavourFlagBits> local_109;
  Flags<CommandFlavourFlagBits> *local_108;
  size_type local_100;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_f8;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_e0;
  allocator<unsigned_long> local_99;
  size_t local_98;
  iterator local_90;
  size_type local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  undefined1 local_68 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = raii;
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = definition;
  determineVectorParams
            ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              *)local_68,this,&commandData->params);
  bVar3 = std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::empty((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                   *)local_68);
  bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
  if (bVar3) {
    local_98 = returnParam;
    local_90 = &local_98;
    local_88 = 1;
    std::allocator<unsigned_long>::allocator(&local_99);
    __l_01._M_len = local_88;
    __l_01._M_array = local_90;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_80,__l_01,&local_99);
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::map(&local_e0,
          (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           *)local_68);
    Flags<CommandFlavourFlagBits>::Flags(&local_10a,enhanced);
    Flags<CommandFlavourFlagBits>::Flags(&local_109,chained);
    local_100 = 2;
    local_108 = &local_10a;
    std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_10b);
    __l_00._M_len = local_100;
    __l_00._M_array = local_108;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&local_f8,__l_00,&local_10b);
    bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
    Flags<CommandFlavourFlagBits>::Flags(&local_13a,enhanced);
    Flags<CommandFlavourFlagBits>::Flags(&local_139,chained);
    local_130 = 2;
    local_138 = &local_13a;
    std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_13b);
    __l._M_len = local_130;
    __l._M_array = local_138;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&local_128,__l,&local_13b);
    generateCommandSetInclusive
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1),
               &local_80,&local_e0,false,&local_f8,(bool)(bVar1 & 1),false,&local_128);
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    ~vector(&local_128);
    std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_13b);
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    ~vector(&local_f8);
    std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_10b);
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map(&local_e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_80);
    std::allocator<unsigned_long>::~allocator(&local_99);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_141);
    std::allocator<char>::~allocator(&local_141);
  }
  local_140 = 1;
  std::
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandResultSingleSuccessWithErrors1ReturnChain(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( vectorParams.empty() )
  {
    return generateCommandSetInclusive( name,
                                        commandData,
                                        initialSkipCount,
                                        definition,
                                        { returnParam },
                                        vectorParams,
                                        false,
                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                        raii,
                                        false,
                                        { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
  }
  return "";
}